

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::finish(cb_explore_adf *data)

{
  pointer pfVar1;
  pointer pvVar2;
  pointer pvVar3;
  action_score *__ptr;
  wclass *pwVar4;
  label *__ptr_00;
  void *__ptr_01;
  pointer ppeVar5;
  ulong uVar6;
  undefined8 *puVar7;
  label *__ptr_02;
  long lVar8;
  
  pfVar1 = (data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (data->min_costs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (data->max_costs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pvVar2 = (data->ex_as).
           super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar2 != (pointer)0x0) {
    operator_delete(pvVar2);
  }
  pvVar3 = (data->ex_costs).
           super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pvVar3 != (pointer)0x0) {
    operator_delete(pvVar3);
  }
  __ptr = (data->action_probs)._begin;
  if (__ptr != (action_score *)0x0) {
    free(__ptr);
  }
  (data->action_probs)._begin = (action_score *)0x0;
  (data->action_probs)._end = (action_score *)0x0;
  (data->action_probs).end_array = (action_score *)0x0;
  pwVar4 = (data->cs_labels).costs._begin;
  if (pwVar4 != (wclass *)0x0) {
    free(pwVar4);
  }
  (data->cs_labels).costs._begin = (wclass *)0x0;
  (data->cs_labels).costs._end = (wclass *)0x0;
  (data->cs_labels).costs.end_array = (wclass *)0x0;
  pwVar4 = (data->cs_labels_2).costs._begin;
  if (pwVar4 != (wclass *)0x0) {
    free(pwVar4);
  }
  (data->cs_labels_2).costs._begin = (wclass *)0x0;
  (data->cs_labels_2).costs._end = (wclass *)0x0;
  (data->cs_labels_2).costs.end_array = (wclass *)0x0;
  __ptr_00 = (data->cb_labels)._begin;
  if (__ptr_00 != (label *)0x0) {
    free(__ptr_00);
  }
  (data->cb_labels)._begin = (label *)0x0;
  (data->cb_labels)._end = (label *)0x0;
  (data->cb_labels).end_array = (label *)0x0;
  __ptr_02 = (data->prepped_cs_labels)._begin;
  if ((data->prepped_cs_labels)._end != __ptr_02) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      __ptr_01 = *(void **)((long)&(__ptr_02->costs)._begin + lVar8);
      if (__ptr_01 != (void *)0x0) {
        free(__ptr_01);
      }
      puVar7 = (undefined8 *)((long)&(__ptr_02->costs)._begin + lVar8);
      *puVar7 = 0;
      puVar7[1] = 0;
      puVar7[2] = 0;
      uVar6 = uVar6 + 1;
      __ptr_02 = (data->prepped_cs_labels)._begin;
      lVar8 = lVar8 + 0x20;
    } while (uVar6 < (ulong)((long)(data->prepped_cs_labels)._end - (long)__ptr_02 >> 5));
  }
  if (__ptr_02 != (label *)0x0) {
    free(__ptr_02);
  }
  (data->prepped_cs_labels)._begin = (label *)0x0;
  (data->prepped_cs_labels)._end = (label *)0x0;
  (data->prepped_cs_labels).end_array = (label *)0x0;
  pwVar4 = (data->gen_cs).pred_scores.costs._begin;
  if (pwVar4 != (wclass *)0x0) {
    free(pwVar4);
  }
  (data->gen_cs).pred_scores.costs._begin = (wclass *)0x0;
  (data->gen_cs).pred_scores.costs._end = (wclass *)0x0;
  (data->gen_cs).pred_scores.costs.end_array = (wclass *)0x0;
  ppeVar5 = (data->gen_cs).mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppeVar5 != (pointer)0x0) {
    operator_delete(ppeVar5);
    return;
  }
  return;
}

Assistant:

void finish(cb_explore_adf& data)
{
  data.top_actions.~vector<float>();
  data.scores.~vector<float>();
  data.min_costs.~vector<float>();
  data.max_costs.~vector<float>();
  data.ex_as.~vector<action_scores>();
  data.ex_costs.~vector<v_array<CB::cb_class>>();
  data.action_probs.delete_v();
  data.cs_labels.costs.delete_v();
  data.cs_labels_2.costs.delete_v();
  data.cb_labels.delete_v();
  for (size_t i = 0; i < data.prepped_cs_labels.size(); i++) data.prepped_cs_labels[i].costs.delete_v();
  data.prepped_cs_labels.delete_v();
  data.gen_cs.pred_scores.costs.delete_v();
  data.gen_cs.mtr_ec_seq.~vector();
}